

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O3

void __thiscall pbrt::Transform::Transform(Transform *this,SquareMatrix<4> *m)

{
  undefined4 *puVar1;
  Float aFVar2 [4];
  undefined1 auVar3 [32];
  ulong uVar4;
  int i;
  long lVar5;
  SquareMatrix<4> *pSVar6;
  SquareMatrix<4> *pSVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 uStack_44;
  undefined8 uStack_3c;
  undefined8 uStack_34;
  undefined8 uStack_2c;
  undefined8 uStack_24;
  undefined8 uStack_1c;
  char local_14;
  
  pSVar7 = &this->mInv;
  lVar5 = 0;
  *(undefined1 (*) [64])(this->m).m = *(undefined1 (*) [64])m->m;
  auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  pSVar6 = pSVar7;
  do {
    auVar8 = vpbroadcastq_avx512vl();
    lVar5 = lVar5 + 1;
    uVar4 = vpcmpeqq_avx512vl(auVar8,auVar3);
    auVar9 = vpmovm2d_avx512vl(uVar4 & 0xf);
    auVar9 = vpsrld_avx(auVar9,0x1f);
    aFVar2 = (Float  [4])vcvtdq2ps_avx(auVar9);
    pSVar6->m[0] = aFVar2;
    pSVar6 = (SquareMatrix<4> *)(pSVar6->m + 1);
  } while (lVar5 != 4);
  Inverse<4>(m);
  if (local_14 == '\0') {
    lVar5 = 0;
    do {
      puVar1 = (undefined4 *)((long)pSVar7->m[0] + lVar5);
      *puVar1 = 0x7fa00000;
      puVar1[1] = 0x7fa00000;
      puVar1[2] = 0x7fa00000;
      puVar1[3] = 0x7fa00000;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
  }
  else {
    *(undefined8 *)pSVar7->m[0] = local_54;
    *(undefined8 *)((this->mInv).m[0] + 2) = uStack_4c;
    *(undefined8 *)(this->mInv).m[1] = uStack_44;
    *(undefined8 *)((this->mInv).m[1] + 2) = uStack_3c;
    *(undefined8 *)(this->mInv).m[2] = uStack_34;
    *(undefined8 *)((this->mInv).m[2] + 2) = uStack_2c;
    *(undefined8 *)(this->mInv).m[3] = uStack_24;
    *(undefined8 *)((this->mInv).m[3] + 2) = uStack_1c;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    Transform(const SquareMatrix<4> &m) : m(m) {
        pstd::optional<SquareMatrix<4>> inv = Inverse(m);
        if (inv)
            mInv = *inv;
        else {
            // Initialize _mInv_ with not-a-number values
            Float NaN = std::numeric_limits<Float>::has_signaling_NaN
                            ? std::numeric_limits<Float>::signaling_NaN()
                            : std::numeric_limits<Float>::quiet_NaN();
            for (int i = 0; i < 4; ++i)
                for (int j = 0; j < 4; ++j)
                    mInv[i][j] = NaN;
        }
    }